

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

void hexToByte(string *hex,BYTE *out)

{
  int iVar1;
  string local_70 [48];
  string local_40 [32];
  int local_20;
  uint local_1c;
  int i;
  int length;
  BYTE *out_local;
  string *hex_local;
  
  _i = out;
  out_local = (BYTE *)hex;
  local_1c = std::__cxx11::string::length();
  for (local_20 = 0; local_20 < (int)local_1c / 2; local_20 = local_20 + 1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)hex);
    iVar1 = std::__cxx11::stoi(local_40,(size_t *)0x0,0x10);
    _i[local_20] = (BYTE)iVar1;
    std::__cxx11::string::~string((string *)local_40);
  }
  if ((local_1c & 1) != 0) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)hex);
    iVar1 = std::__cxx11::stoi(local_70,(size_t *)0x0,0x10);
    _i[(int)local_1c / 2] = (BYTE)iVar1;
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void hexToByte(string hex, BYTE* out) {
	int length = hex.length();
	for (int i = 0; i < length / 2; i++) {
		out[i] = stoi(hex.substr(length - 2 - i * 2, 2), 0, 16);
	}
	if ((length & 1) != 0)
		out[length / 2] = stoi(hex.substr(0, 1), 0, 16);
}